

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageboxbutton.cpp
# Opt level: O1

void __thiscall QtMWidgets::MsgBoxButton::paintEvent(MsgBoxButton *this,QPaintEvent *param_1)

{
  long lVar1;
  MsgBoxButtonPrivate *pMVar2;
  ColorGroup CVar3;
  long *plVar4;
  QPainter p;
  QColor c;
  undefined1 auStack_58 [8];
  qreal local_50;
  qreal local_48;
  QString local_38;
  double local_20;
  
  QPainter::QPainter((QPainter *)auStack_58,(QPaintDevice *)&this->field_0x10);
  CVar3 = QWidget::palette();
  QPalette::brush(CVar3,Dark);
  QPainter::setPen((QColor *)auStack_58);
  lVar1 = *(long *)&this->field_0x20;
  local_38.d.size = (qsizetype)(double)((*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + 1);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  local_20 = (double)((*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18)) + 1);
  pMVar2 = (this->d).d;
  QTextOption::QTextOption((QTextOption *)&local_50,0x84);
  QPainter::drawText((QRectF *)auStack_58,&local_38,(QTextOption *)&pMVar2->text);
  QTextOption::~QTextOption((QTextOption *)&local_50);
  if (((this->d).d)->pressed == true) {
    CVar3 = QWidget::palette();
    plVar4 = (long *)QPalette::brush(CVar3,Dark);
    local_38.d.d = *(Data **)(*plVar4 + 8);
    local_38.d.ptr = *(char16_t **)(*plVar4 + 0x10);
    QColor::setAlpha((int)&local_38);
    QPainter::setPen((PenStyle)auStack_58);
    QBrush::QBrush((QBrush *)&local_50,(QColor *)&local_38,SolidPattern);
    QPainter::setBrush((QBrush *)auStack_58);
    QBrush::~QBrush((QBrush *)&local_50);
    lVar1 = *(long *)&this->field_0x20;
    local_48 = (qreal)CONCAT44(*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18),
                               *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14));
    local_50 = 0.0;
    QPainter::drawRects((QRect *)auStack_58,(int)&local_50);
  }
  QPainter::~QPainter((QPainter *)auStack_58);
  return;
}

Assistant:

void
MsgBoxButton::paintEvent( QPaintEvent * )
{
	QPainter p( this );

	p.setPen( palette().color( QPalette::WindowText ) );

	p.drawText( rect(), d->text, QTextOption( Qt::AlignCenter ) );

	if( d->pressed )
	{
		QColor c = palette().color( QPalette::Highlight );
		c.setAlpha( 75 );

		p.setPen( Qt::NoPen );
		p.setBrush( c );
		p.drawRect( rect() );
	}
}